

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::initSlowCase(APInt *this,uint64_t val,bool isSigned)

{
  uint uVar1;
  uint64_t *puVar2;
  uint local_20;
  uint i;
  bool isSigned_local;
  uint64_t val_local;
  APInt *this_local;
  
  uVar1 = getNumWords(this);
  puVar2 = getClearedMemory(uVar1);
  (this->U).pVal = puVar2;
  *(this->U).pVal = val;
  if ((isSigned) && ((long)val < 0)) {
    for (local_20 = 1; uVar1 = getNumWords(this), local_20 < uVar1; local_20 = local_20 + 1) {
      (this->U).pVal[local_20] = 0xffffffffffffffff;
    }
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::initSlowCase(uint64_t val, bool isSigned) {
  U.pVal = getClearedMemory(getNumWords());
  U.pVal[0] = val;
  if (isSigned && int64_t(val) < 0)
    for (unsigned i = 1; i < getNumWords(); ++i)
      U.pVal[i] = WORD_MAX;
  clearUnusedBits();
}